

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i)

{
  DenseMatrix *this_00;
  int64_t iVar1;
  Matrix *this_01;
  Matrix *pMVar2;
  real *prVar3;
  int in_EDX;
  int64_t j;
  undefined4 in_stack_ffffffffffffffb8;
  real rVar4;
  int64_t in_stack_ffffffffffffffc0;
  Vector *this_02;
  Matrix *in_stack_ffffffffffffffc8;
  Vector *local_20;
  
  if (in_EDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                  ,0x70,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
  }
  this_00 = (DenseMatrix *)(long)in_EDX;
  iVar1 = Matrix::size(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if ((long)this_00 < iVar1) {
    this_01 = (Matrix *)Vector::size((Vector *)0x15c5f4);
    pMVar2 = (Matrix *)Matrix::size(this_01,in_stack_ffffffffffffffc0);
    if (this_01 == pMVar2) {
      local_20 = (Vector *)0x0;
      while( true ) {
        this_02 = local_20;
        iVar1 = Matrix::size(this_01,(int64_t)local_20);
        if (iVar1 <= (long)this_02) break;
        prVar3 = at(this_00,(int64_t)this_01,(int64_t)this_02);
        rVar4 = *prVar3;
        prVar3 = Vector::operator[](this_02,CONCAT44(rVar4,in_stack_ffffffffffffffb8));
        *prVar3 = rVar4 + *prVar3;
        local_20 = (Vector *)
                   ((long)&(local_20->data_).super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1);
      }
      return;
    }
    __assert_fail("x.size() == this->size(1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                  ,0x72,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                ,0x71,"virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < this->size(1); j++) {
    x[j] += at(i, j);
  }
}